

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O3

tab_data * __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data>::allocate_array
          (memory_manager_stateless_kernel_1<dlib::tabbed_display::tab_data> *this,
          unsigned_long size)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined1 auVar3 [16];
  unsigned_long *puVar4;
  ulong uVar5;
  long lVar6;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = size;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x50),8) == 0) {
    uVar5 = SUB168(auVar3 * ZEXT816(0x50),0) | 8;
  }
  puVar4 = (unsigned_long *)operator_new__(uVar5);
  *puVar4 = size;
  if (size != 0) {
    lVar6 = 0;
    do {
      *(long *)((long)&(((tab_data *)(puVar4 + 1))->name)._M_dataplus._M_p + lVar6) =
           (long)puVar4 + lVar6 + 0x18;
      *(undefined8 *)((long)puVar4 + lVar6 + 0x10) = 0;
      *(undefined4 *)((long)puVar4 + lVar6 + 0x18) = 0;
      puVar1 = (undefined8 *)((long)puVar4 + lVar6 + 0x28);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)puVar4 + lVar6 + 0x38) = 0;
      puVar2 = (undefined4 *)((long)puVar4 + lVar6 + 0x40);
      *puVar2 = 0xffffffff;
      puVar2[1] = 0xffffffff;
      puVar2[2] = 0xffffffff;
      puVar2[3] = 0xffffffff;
      *(undefined8 *)((long)puVar4 + lVar6 + 0x50) = 0;
      lVar6 = lVar6 + 0x50;
    } while (size * 0x50 != lVar6);
  }
  return (tab_data *)(puVar4 + 1);
}

Assistant:

T* allocate_array (
                unsigned long size
            ) 
            { 
                return new T[size];
            }